

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Base.cpp
# Opt level: O3

void __thiscall adios2::format::BP4Base::ReadElementIndexHeader(BP4Base *this)

{
  size_t *in_RCX;
  vector<char,_std::allocator<char>_> *in_RDX;
  long *in_RSI;
  bool in_R8B;
  
  ReadElementIndexHeader
            ((ElementIndexHeader *)this,(BP4Base *)((long)in_RSI + *(long *)(*in_RSI + -0x20)),
             in_RDX,in_RCX,in_R8B);
  return;
}

Assistant:

BP4Base::ElementIndexHeader
BP4Base::ReadElementIndexHeader(const std::vector<char> &buffer, size_t &position,
                                const bool isLittleEndian) const noexcept
{
    ElementIndexHeader header;
    header.Length = helper::ReadValue<uint32_t>(buffer, position, isLittleEndian);
    header.MemberID = helper::ReadValue<uint32_t>(buffer, position, isLittleEndian);
    header.GroupName = ReadBPString(buffer, position, isLittleEndian);
    header.Name = ReadBPString(buffer, position, isLittleEndian);
    // header.Path = ReadBP4String(buffer, position, isLittleEndian);
    header.Path = "";
    header.Order = helper::ReadValue<char>(buffer, position, isLittleEndian);
    // uint8_t unused =
    helper::ReadValue<uint8_t>(buffer, position, isLittleEndian);

    header.DataType = helper::ReadValue<int8_t>(buffer, position, isLittleEndian);
    header.CharacteristicsSetsCount = helper::ReadValue<uint64_t>(buffer, position, isLittleEndian);

    return header;
}